

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O1

void helper_mtc0_saar_mips64(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  
  uVar1 = env->CP0_SAARI & 0x3f;
  if (uVar1 < 2) {
    env->CP0_SAAR[uVar1] = arg1 & 0xffffffff03f;
  }
  return;
}

Assistant:

void helper_mtc0_saar(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t target = env->CP0_SAARI & 0x3f;
    if (target < 2) {
        env->CP0_SAAR[target] = arg1 & 0x00000ffffffff03fULL;
        switch (target) {
        case 0:
            if (env->itu) {
                // itc_reconfigure(env->itu);
            }
            break;
        }
    }
}